

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_sbo_cow.hpp
# Opt level: O0

handle_base * __thiscall
printable_sbo_cow::handle<large_printable,_true>::clone_into
          (handle<large_printable,_true> *this,buffer *buf)

{
  handle_base *phVar1;
  large_printable local_2030;
  buffer *local_18;
  buffer *buf_local;
  handle<large_printable,_true> *this_local;
  
  local_18 = buf;
  buf_local = (buffer *)this;
  large_printable::large_printable(&local_2030,&this->value_);
  phVar1 = clone_impl<large_printable>(&local_2030,local_18);
  large_printable::~large_printable(&local_2030);
  return phVar1;
}

Assistant:

virtual handle_base * clone_into (buffer & buf) const
        { return clone_impl(value_, buf); }